

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_write(mg_connection *conn,void *buf,size_t len)

{
  int iVar1;
  time_t tVar2;
  int len_00;
  bool bVar3;
  int local_44;
  int local_3c;
  int local_38;
  int allowed;
  int total;
  int n;
  time_t now;
  size_t len_local;
  void *buf_local;
  mg_connection *conn_local;
  
  if (conn == (mg_connection *)0x0) {
    conn_local._4_4_ = 0;
  }
  else if (len < 0x80000000) {
    conn->request_state = 10;
    len_00 = (int)len;
    if (conn->throttle < 1) {
      local_38 = push_all(conn->phys_ctx,(FILE *)0x0,(conn->client).sock,conn->ssl,(char *)buf,
                          len_00);
    }
    else {
      tVar2 = time((time_t *)0x0);
      if (tVar2 != conn->last_throttle_time) {
        conn->last_throttle_time = tVar2;
        conn->last_throttle_bytes = 0;
      }
      local_3c = conn->throttle - conn->last_throttle_bytes;
      if (len_00 < local_3c) {
        local_3c = len_00;
      }
      local_38 = push_all(conn->phys_ctx,(FILE *)0x0,(conn->client).sock,conn->ssl,(char *)buf,
                          local_3c);
      if (local_38 == local_3c) {
        len_local = (long)buf + (long)local_38;
        conn->last_throttle_bytes = local_38 + conn->last_throttle_bytes;
        while( true ) {
          bVar3 = false;
          if (local_38 < len_00) {
            bVar3 = conn->phys_ctx->stop_flag == 0;
          }
          if (!bVar3) break;
          if (len_00 - local_38 < conn->throttle) {
            local_44 = len_00 - local_38;
          }
          else {
            local_44 = conn->throttle;
          }
          iVar1 = push_all(conn->phys_ctx,(FILE *)0x0,(conn->client).sock,conn->ssl,
                           (char *)len_local,local_44);
          if (iVar1 != local_44) break;
          sleep(1);
          conn->last_throttle_bytes = local_44;
          tVar2 = time((time_t *)0x0);
          conn->last_throttle_time = tVar2;
          len_local = len_local + (long)iVar1;
          local_38 = iVar1 + local_38;
        }
      }
    }
    if (0 < local_38) {
      conn->num_bytes_sent = (long)local_38 + conn->num_bytes_sent;
    }
    conn_local._4_4_ = local_38;
  }
  else {
    conn_local._4_4_ = -1;
  }
  return conn_local._4_4_;
}

Assistant:

CIVETWEB_API int
mg_write(struct mg_connection *conn, const void *buf, size_t len)
{
	time_t now;
	int n, total, allowed;

	if (conn == NULL) {
		return 0;
	}
	if (len > INT_MAX) {
		return -1;
	}

	/* Mark connection as "data sent" */
	conn->request_state = 10;
#if defined(USE_HTTP2)
	if (conn->protocol_type == PROTOCOL_TYPE_HTTP2) {
		http2_data_frame_head(conn, len, 0);
	}
#endif

	if (conn->throttle > 0) {
		if ((now = time(NULL)) != conn->last_throttle_time) {
			conn->last_throttle_time = now;
			conn->last_throttle_bytes = 0;
		}
		allowed = conn->throttle - conn->last_throttle_bytes;
		if (allowed > (int)len) {
			allowed = (int)len;
		}

		total = push_all(conn->phys_ctx,
		                 NULL,
		                 conn->client.sock,
		                 conn->ssl,
		                 (const char *)buf,
		                 allowed);

		if (total == allowed) {

			buf = (const char *)buf + total;
			conn->last_throttle_bytes += total;
			while ((total < (int)len)
			       && STOP_FLAG_IS_ZERO(&conn->phys_ctx->stop_flag)) {
				allowed = (conn->throttle > ((int)len - total))
				              ? (int)len - total
				              : conn->throttle;

				n = push_all(conn->phys_ctx,
				             NULL,
				             conn->client.sock,
				             conn->ssl,
				             (const char *)buf,
				             allowed);

				if (n != allowed) {
					break;
				}
				sleep(1);
				conn->last_throttle_bytes = allowed;
				conn->last_throttle_time = time(NULL);
				buf = (const char *)buf + n;
				total += n;
			}
		}
	} else {
		total = push_all(conn->phys_ctx,
		                 NULL,
		                 conn->client.sock,
		                 conn->ssl,
		                 (const char *)buf,
		                 (int)len);
	}
	if (total > 0) {
		conn->num_bytes_sent += total;
	}
	return total;
}